

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene_bsp.cpp
# Opt level: O0

void __thiscall
QGraphicsSceneBspTree::climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
          (QGraphicsSceneBspTree *this,anon_class_16_2_a6e56972 *visitor,QRectF *rect,int index)

{
  Type TVar1;
  bool bVar2;
  const_reference items;
  int in_ECX;
  QRectF *in_RDX;
  QGraphicsSceneBspTree *in_RSI;
  QGraphicsSceneBspTree *in_RDI;
  qreal qVar3;
  int childIndex;
  Node *node;
  qsizetype in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int iVar4;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar2 = QList<QGraphicsSceneBspTree::Node>::isEmpty
                    ((QList<QGraphicsSceneBspTree::Node> *)0xa19a56);
  if (!bVar2) {
    items = QList<QGraphicsSceneBspTree::Node>::at
                      ((QList<QGraphicsSceneBspTree::Node> *)
                       CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       in_stack_ffffffffffffffb8);
    firstChildIndex(in_RDI,in_ECX);
    TVar1 = items->type;
    if (TVar1 == Horizontal) {
      qVar3 = QRectF::top(in_RDX);
      iVar4 = (int)((ulong)items >> 0x20);
      if ((items->field_0).offset <= qVar3) {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (in_RSI,(anon_class_16_2_a6e56972 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar4);
      }
      else {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (in_RSI,(anon_class_16_2_a6e56972 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar4);
        qVar3 = QRectF::bottom(in_RDX);
        if ((items->field_0).offset <= qVar3) {
          climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                    (in_RSI,(anon_class_16_2_a6e56972 *)in_RDX,
                     (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)items >> 0x20));
        }
      }
    }
    else if (TVar1 == Vertical) {
      qVar3 = QRectF::left(in_RDX);
      iVar4 = (int)((ulong)items >> 0x20);
      if ((items->field_0).offset <= qVar3) {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (in_RSI,(anon_class_16_2_a6e56972 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar4);
      }
      else {
        climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                  (in_RSI,(anon_class_16_2_a6e56972 *)in_RDX,
                   (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),iVar4);
        qVar3 = QRectF::right(in_RDX);
        if ((items->field_0).offset <= qVar3) {
          climbTree<QGraphicsSceneBspTree::items(QRectF_const&,bool)const::__0&>
                    (in_RSI,(anon_class_16_2_a6e56972 *)in_RDX,
                     (QRectF *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                     (int)((ulong)items >> 0x20));
        }
      }
    }
    else if (TVar1 == Leaf) {
      QList<QList<QGraphicsItem_*>_>::operator[]
                ((QList<QList<QGraphicsItem_*>_> *)CONCAT44(2,in_stack_ffffffffffffffc0),
                 (qsizetype)in_RSI);
      QGraphicsSceneBspTree::items::anon_class_16_2_a6e56972::operator()
                ((anon_class_16_2_a6e56972 *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                 (QList<QGraphicsItem_*> *)items);
    }
  }
  return;
}

Assistant:

void QGraphicsSceneBspTree::climbTree(Visitor &&visitor, const QRectF &rect, int index) const
{
    if (nodes.isEmpty())
        return;

    const Node &node = nodes.at(index);
    const int childIndex = firstChildIndex(index);

    switch (node.type) {
    case Node::Leaf: {
        visitor(const_cast<QList<QGraphicsItem*>*>(&leaves[node.leafIndex]));
        break;
    }
    case Node::Vertical:
        if (rect.left() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.right() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
        break;
    case Node::Horizontal:
        if (rect.top() < node.offset) {
            climbTree(visitor, rect, childIndex);
            if (rect.bottom() >= node.offset)
                climbTree(visitor, rect, childIndex + 1);
        } else {
            climbTree(visitor, rect, childIndex + 1);
        }
    }
}